

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive *pZip,mz_uint file_index)

{
  mz_zip_internal_state *pmVar1;
  void *pvVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (pZip != (mz_zip_archive *)0x0) {
    pmVar1 = pZip->m_pState;
    if (((pmVar1 == (mz_zip_internal_state *)0x0) || (pZip->m_total_files <= file_index)) ||
       (pvVar2 = (pmVar1->m_central_dir).m_p, pvVar2 == (void *)0x0)) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      return uVar3;
    }
    uVar3 = (uint)((*(byte *)((long)pvVar2 +
                             (ulong)*(uint *)((long)(pmVar1->m_central_dir_offsets).m_p +
                                             (ulong)file_index * 4) + 8) & 0x41) != 0);
  }
  return uVar3;
}

Assistant:

mz_bool mz_zip_reader_is_file_encrypted(mz_zip_archive *pZip,
                                        mz_uint file_index) {
  mz_uint m_bit_flag;
  const mz_uint8 *p = mz_zip_get_cdh(pZip, file_index);
  if (!p) {
    mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    return MZ_FALSE;
  }

  m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  return (m_bit_flag &
          (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED |
           MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION)) != 0;
}